

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O0

int Res_SatAddEqual(sat_solver *pSat,int iVar0,int iVar1,int fCompl)

{
  int iVar2;
  lit local_2c;
  lit local_28;
  lit Lits [2];
  int fCompl_local;
  int iVar1_local;
  int iVar0_local;
  sat_solver *pSat_local;
  
  Lits[0] = fCompl;
  Lits[1] = iVar1;
  local_2c = toLitCond(iVar0,0);
  local_28 = toLitCond(Lits[1],(uint)((Lits[0] != 0 ^ 0xffU) & 1));
  iVar2 = sat_solver_addclause(pSat,&local_2c,Lits);
  if (iVar2 == 0) {
    pSat_local._4_4_ = 0;
  }
  else {
    local_2c = toLitCond(iVar0,1);
    local_28 = toLitCond(Lits[1],Lits[0]);
    iVar2 = sat_solver_addclause(pSat,&local_2c,Lits);
    if (iVar2 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      pSat_local._4_4_ = 1;
    }
  }
  return pSat_local._4_4_;
}

Assistant:

int Res_SatAddEqual( sat_solver * pSat, int iVar0, int iVar1, int fCompl )
{
    lit Lits[2];

    Lits[0] = toLitCond( iVar0, 0 );
    Lits[1] = toLitCond( iVar1, !fCompl );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar0, 1 );
    Lits[1] = toLitCond( iVar1, fCompl );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    return 1;
}